

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::ElementsAreMatcherImpl<const_phmap::priv::BitMask<unsigned_char,_8,_0>_&>::
MatchAndExplain(ElementsAreMatcherImpl<const_phmap::priv::BitMask<unsigned_char,_8,_0>_&> *this,
               BitMask<unsigned_char,_8,_0> *container,MatchResultListener *listener)

{
  string *psVar1;
  pointer pMVar2;
  bool bVar3;
  bool bVar4;
  size_t __n;
  pointer pMVar5;
  MatchResultListener *pMVar6;
  MatcherBase<const_int_&> *pMVar7;
  ostream *poVar8;
  reference pvVar9;
  string *psVar10;
  ulong uVar11;
  string *s_1;
  size_t i_1;
  undefined1 local_290 [3];
  bool reason_printed;
  pointer local_270;
  size_t i;
  undefined1 local_260 [3];
  BitMask<unsigned_char,_8,_0> unmatched_it;
  BitMask<unsigned_char,_8,_0> local_251;
  pointer local_250;
  size_t actual_count;
  string local_240;
  uint32_t local_21c;
  undefined1 local_218 [8];
  StringMatchResultListener s;
  bool match;
  pointer pMStack_78;
  bool unmatched_found;
  size_t exam_pos;
  const_reference ptStack_68;
  BitMask<unsigned_char,_8,_0> it;
  StlContainerReference stl_container;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_49;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  bool listener_interested;
  MatchResultListener *listener_local;
  BitMask<unsigned_char,_8,_0> *container_local;
  ElementsAreMatcherImpl<const_phmap::priv::BitMask<unsigned_char,_8,_0>_&> *this_local;
  
  explanations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       MatchResultListener::IsInterested(listener);
  __n = count(this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_49);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48,__n,&local_49);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_49);
  ptStack_68 = StlContainerView<phmap::priv::BitMask<unsigned_char,_8,_0>_>::ConstReference
                         (container);
  exam_pos._7_1_ = phmap::priv::BitMask<unsigned_char,_8,_0>::begin(ptStack_68);
  pMStack_78 = (pointer)0x0;
  s._407_1_ = 0;
  while( true ) {
    s._406_1_ = phmap::priv::BitMask<unsigned_char,_8,_0>::end(ptStack_68);
    bVar3 = phmap::priv::operator!=
                      ((BitMask<unsigned_char,_8,_0> *)((long)&exam_pos + 7),
                       (BitMask<unsigned_char,_8,_0> *)&s.field_0x196);
    pMVar2 = pMStack_78;
    bVar4 = false;
    if (bVar3) {
      pMVar5 = (pointer)count(this);
      bVar4 = pMVar2 != pMVar5;
    }
    if (!bVar4) goto LAB_00180b91;
    if ((explanations.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      pMVar7 = &std::
                vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                ::operator[](&this->matchers_,(size_type)pMStack_78)->super_MatcherBase<const_int_&>
      ;
      actual_count._4_4_ =
           phmap::priv::BitMask<unsigned_char,_8,_0>::operator*
                     ((BitMask<unsigned_char,_8,_0> *)((long)&exam_pos + 7));
      s._405_1_ = MatcherBase<const_int_&>::Matches(pMVar7,(int *)((long)&actual_count + 4));
    }
    else {
      StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_218);
      pMVar7 = &std::
                vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                ::operator[](&this->matchers_,(size_type)pMStack_78)->super_MatcherBase<const_int_&>
      ;
      local_21c = phmap::priv::BitMask<unsigned_char,_8,_0>::operator*
                            ((BitMask<unsigned_char,_8,_0> *)((long)&exam_pos + 7));
      s._405_1_ = MatcherBase<const_int_&>::MatchAndExplain
                            (pMVar7,(int *)&local_21c,(MatchResultListener *)local_218);
      StringMatchResultListener::str_abi_cxx11_(&local_240,(StringMatchResultListener *)local_218);
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,(size_type)pMStack_78);
      std::__cxx11::string::operator=((string *)pvVar9,(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_218);
    }
    if ((s._405_1_ & 1) == 0) break;
    phmap::priv::BitMask<unsigned_char,_8,_0>::operator++
              ((BitMask<unsigned_char,_8,_0> *)((long)&exam_pos + 7));
    pMStack_78 = (pointer)((long)&(pMStack_78->super_MatcherBase<const_int_&>).
                                  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                          1);
  }
  s._407_1_ = 1;
LAB_00180b91:
  local_250 = pMStack_78;
  while( true ) {
    local_251 = phmap::priv::BitMask<unsigned_char,_8,_0>::end(ptStack_68);
    bVar4 = phmap::priv::operator!=
                      ((BitMask<unsigned_char,_8,_0> *)((long)&exam_pos + 7),&local_251);
    pMVar2 = local_250;
    if (!bVar4) break;
    local_250 = (pointer)((long)&(local_250->super_MatcherBase<const_int_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 1
                         );
    phmap::priv::BitMask<unsigned_char,_8,_0>::operator++
              ((BitMask<unsigned_char,_8,_0> *)((long)&exam_pos + 7));
  }
  pMVar5 = (pointer)count(this);
  if (pMVar2 == pMVar5) {
    if ((s._407_1_ & 1) == 0) {
      if ((explanations.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        i_1._3_1_ = 0;
        for (s_1 = (string *)0x0; psVar1 = s_1, psVar10 = (string *)count(this), psVar1 != psVar10;
            s_1 = (string *)&s_1->field_0x1) {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_48,(size_type)s_1);
          uVar11 = std::__cxx11::string::empty();
          if ((uVar11 & 1) == 0) {
            if ((i_1._3_1_ & 1) != 0) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar6 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            pMVar6 = MatchResultListener::operator<<(pMVar6,(unsigned_long *)&s_1);
            pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [11])" matches, ");
            MatchResultListener::operator<<(pMVar6,pvVar9);
            i_1._3_1_ = 1;
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      if ((explanations.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        i._3_1_ = phmap::priv::BitMask<unsigned_char,_8,_0>::begin(ptStack_68);
        for (local_270 = (pointer)0x0; local_270 != pMStack_78;
            local_270 = (pointer)((long)&(local_270->super_MatcherBase<const_int_&>).
                                         super_MatcherDescriberInterface.
                                         _vptr_MatcherDescriberInterface + 1)) {
          phmap::priv::BitMask<unsigned_char,_8,_0>::operator++
                    ((BitMask<unsigned_char,_8,_0> *)((long)&i + 3));
        }
        pMVar6 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
        pMVar6 = MatchResultListener::operator<<(pMVar6,(unsigned_long *)&stack0xffffffffffffff88);
        pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [3])0x21c77b);
        i_1._4_4_ = phmap::priv::BitMask<unsigned_char,_8,_0>::operator*
                              ((BitMask<unsigned_char,_8,_0> *)((long)&i + 3));
        PrintToString<unsigned_int>((string *)local_290,(uint *)((long)&i_1 + 4));
        pMVar6 = MatchResultListener::operator<<
                           (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_290);
        MatchResultListener::operator<<(pMVar6,(char (*) [3])") ");
        std::__cxx11::string::~string((string *)local_290);
        pMVar7 = &std::
                  vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ::operator[](&this->matchers_,(size_type)pMStack_78)->
                  super_MatcherBase<const_int_&>;
        poVar8 = MatchResultListener::stream(listener);
        MatcherBase<const_int_&>::DescribeNegationTo(pMVar7,poVar8);
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_48,(size_type)pMStack_78);
        poVar8 = MatchResultListener::stream(listener);
        PrintIfNotEmpty(pvVar9,poVar8);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    if (((explanations.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) &&
       (local_250 != (pointer)0x0)) {
      pMVar6 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
      Elements((ElementsAreMatcherImpl<const_phmap::priv::BitMask<unsigned_char,_8,_0>_&> *)
               local_260,(size_t)local_250);
      MatchResultListener::operator<<(pMVar6,(Message *)local_260);
      Message::~Message((Message *)local_260);
    }
    this_local._7_1_ = false;
  }
  i._4_4_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return this_local._7_1_;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    auto it = stl_container.begin();
    size_t exam_pos = 0;
    bool unmatched_found = false;

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        unmatched_found = true;
        // We cannot store the iterator for the unmatched element to be used
        // later, as some users use ElementsAre() with a "container" whose
        // iterator is not copy-constructible or copy-assignable.
        //
        // We cannot store a pointer to the element either, as some container's
        // iterators return a temporary.
        //
        // We cannot store the element itself either, as the element may not be
        // copyable.
        //
        // Therefore, we just remember the index of the unmatched element,
        // and use it later to print the unmatched element.
        break;
      }
    }
    // If unmatched_found is true, exam_pos is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (unmatched_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        // Find the unmatched element.
        auto unmatched_it = stl_container.begin();
        // We cannot call std::advance() on the iterator, as some users use
        // ElementsAre() with a "container" whose iterator is incompatible with
        // std::advance() (e.g. it may not have the difference_type member
        // type).
        for (size_t i = 0; i != exam_pos; ++i) {
          ++unmatched_it;
        }

        // If the array is long or the elements' print-out is large, it may be
        // hard for the user to find the mismatched element and its
        // corresponding matcher description. Therefore we print the index, the
        // value of the mismatched element, and the corresponding matcher
        // description to ease debugging.
        *listener << "whose element #" << exam_pos << " ("
                  << PrintToString(*unmatched_it) << ") ";
        matchers_[exam_pos].DescribeNegationTo(listener->stream());
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }